

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

void lua_concat(lua_State *L,int n)

{
  TValue *pTVar1;
  TValue *pTVar2;
  TValue *top;
  int n_local;
  lua_State *L_local;
  
  if (n < 2) {
    if (n == 0) {
      L->top->u64 = (L->glref).ptr64 + 0x78 | 0xfffd800000000000;
      pTVar2 = L->top;
      L->top = pTVar2 + 1;
      if ((TValue *)(L->maxstack).ptr64 <= pTVar2 + 1) {
        lj_state_growstack1(L);
      }
    }
  }
  else {
    top._4_4_ = n + -1;
    do {
      pTVar2 = lj_meta_cat(L,L->top + -1,-top._4_4_);
      if (pTVar2 == (TValue *)0x0) {
        L->top = L->top + -(long)top._4_4_;
        return;
      }
      pTVar1 = L->top;
      L->top = pTVar2 + 2;
      lj_vm_call(L,pTVar2,2);
      L->top = L->top + -2;
      L->top[-1] = L->top[1];
      top._4_4_ = (top._4_4_ - (int)((long)pTVar1 - (long)pTVar2 >> 3)) + -1;
    } while (0 < top._4_4_);
  }
  return;
}

Assistant:

LUA_API void lua_concat(lua_State *L, int n)
{
  lj_checkapi_slot(n);
  if (n >= 2) {
    n--;
    do {
      TValue *top = lj_meta_cat(L, L->top-1, -n);
      if (top == NULL) {
	L->top -= n;
	break;
      }
      n -= (int)(L->top - top);
      L->top = top+2;
      lj_vm_call(L, top, 1+1);
      L->top -= 1+LJ_FR2;
      copyTV(L, L->top-1, L->top+LJ_FR2);
    } while (--n > 0);
  } else if (n == 0) {  /* Push empty string. */
    setstrV(L, L->top, &G(L)->strempty);
    incr_top(L);
  }
  /* else n == 1: nothing to do. */
}